

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

SiameseResult __thiscall
siamese::Encoder::GenerateCauchyPacket(Encoder *this,SiameseRecoveryPacket *packet)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  uint uVar5;
  reference pvVar6;
  undefined1 *puVar7;
  uint *in_RSI;
  long in_RDI;
  uint footerBytes;
  uint count_1;
  uint element_1;
  uint originalBytes_1;
  uint8_t y;
  OriginalPacket *original_1;
  uint cauchyColumn;
  uint cauchyRow;
  uint count;
  uint element;
  uint originalBytes;
  OriginalPacket *original;
  uint nextParityElement;
  uint usedBytes;
  RecoveryMetadata metadata;
  uint unacknowledgedCount;
  uint recoveryBytes;
  uint firstElement;
  uint bytes;
  uint8_t x_i_1;
  uint8_t y_j_1;
  uint8_t x_i;
  uint8_t y_j;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffff828;
  Allocator *in_stack_fffffffffffff830;
  GrowingAlignedDataBuffer *in_stack_fffffffffffff838;
  LogStringBuffer *buffer_00;
  OutputWorker *this_00;
  uint local_774;
  uint local_75c;
  uint local_750;
  uint local_738;
  uint local_734;
  uint local_730;
  uint local_72c;
  uint local_728;
  uint local_724;
  int local_720;
  uint local_71c;
  uint *local_718;
  SiameseResult local_708;
  uint local_704;
  long local_700;
  uint local_6f4;
  long local_6f0;
  uint local_6e4;
  long local_6e0;
  uint local_6d4;
  long local_6d0;
  int local_6c4;
  long local_6c0;
  uint local_6b8;
  uint local_6b4;
  long local_6b0;
  int local_6a4;
  int local_6a0;
  int local_69c;
  uint local_698;
  uint local_694;
  uint local_690;
  uint local_68c;
  undefined1 *local_688;
  uint *local_680;
  char local_676;
  undefined1 local_675;
  uint local_674;
  int local_670;
  char local_66a;
  undefined1 local_669;
  uint local_668;
  int local_664;
  uint *local_660;
  char *local_658;
  uint *local_650;
  char *local_648;
  uint *local_640;
  char *local_638;
  undefined8 in_stack_fffffffffffff9d0;
  void *in_stack_fffffffffffff9d8;
  void *in_stack_fffffffffffff9e0;
  int local_5cc;
  undefined8 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  int iVar8;
  void *in_stack_fffffffffffffa48;
  int local_5a8;
  ostream aoStack_520 [324];
  int in_stack_fffffffffffffc24;
  void *in_stack_fffffffffffffc28;
  uint8_t in_stack_fffffffffffffc37;
  void *in_stack_fffffffffffffc38;
  
  local_71c = *(uint *)(in_RDI + 0x230);
  local_720 = *(int *)(in_RDI + 0x22c);
  local_718 = in_RSI;
  bVar3 = GrowingAlignedDataBuffer::Initialize
                    (in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                     (uint)((ulong)in_stack_fffffffffffff828 >> 0x20));
  if (bVar3) {
    local_72c = EncoderPacketWindow::GetUnacknowledgedCount((EncoderPacketWindow *)(in_RDI + 0x210))
    ;
    local_6b0 = in_RDI + 0x210;
    local_6b4 = local_71c;
    local_69c = *(int *)(in_RDI + 0x228);
    local_698 = local_71c;
    local_730 = local_71c + local_69c & 0x3fffff;
    local_6c0 = in_RDI + 0x210;
    local_6c4 = *(int *)(in_RDI + 0x6dc);
    local_6a4 = *(int *)(in_RDI + 0x228);
    uVar5 = local_6c4 - local_6a4 & 0x3fffff;
    local_728 = local_72c;
    local_724 = local_72c;
    local_6a0 = local_6c4;
    if ((local_71c < uVar5) && (local_6b8 = uVar5, uVar5 < 0x200000)) {
      iVar8 = *(int *)(in_RDI + 0x6e0);
      local_734 = iVar8 + 1;
      uVar5 = *(int *)(in_RDI + 0x6e0) + 1;
      *(uint *)(in_RDI + 0x6e0) = uVar5;
      if (0xbf < uVar5) {
        *(undefined4 *)(in_RDI + 0x6e0) = 0;
      }
      local_75c = local_71c + local_69c & 0x3f;
      local_6f0 = in_RDI + 0x210;
      local_6f4 = local_71c;
      pvVar6 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                         ((array<siamese::OriginalPacket,_64UL> *)in_stack_fffffffffffff830,
                          (size_type)in_stack_fffffffffffff828);
      local_669 = (undefined1)local_75c;
      local_66a = (char)iVar8 + '@';
      local_738 = (pvVar6->Buffer).Bytes;
      local_668 = local_75c;
      local_664 = iVar8;
      gf256_mul_mem(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                    (uint8_t)((ulong)in_stack_fffffffffffff9d0 >> 0x38),
                    (int)in_stack_fffffffffffff9d0);
      memset((void *)(*(long *)(in_RDI + 0x6c8) + (ulong)local_738),0,(ulong)(local_720 - local_738)
            );
      uVar5 = *(uint *)(in_RDI + 0x224);
      local_774 = local_71c;
      while (local_774 = local_774 + 1, local_774 < uVar5) {
        local_75c = local_75c + 1 & 0x3f;
        local_700 = in_RDI + 0x210;
        local_704 = local_774;
        pvVar6 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                           ((array<siamese::OriginalPacket,_64UL> *)in_stack_fffffffffffff830,
                            (size_type)in_stack_fffffffffffff828);
        uVar1 = (pvVar6->Buffer).Bytes;
        local_675 = (undefined1)local_75c;
        local_676 = (char)iVar8 + '@';
        local_674 = local_75c;
        local_670 = iVar8;
        gf256_muladd_mem(in_stack_fffffffffffffc38,in_stack_fffffffffffffc37,
                         in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
        if (local_738 < uVar1) {
          local_738 = uVar1;
        }
      }
    }
    else {
      *(uint *)(in_RDI + 0x6dc) = local_730 + local_72c & 0x3fffff;
      local_734 = 0;
      local_6d0 = in_RDI + 0x210;
      local_6d4 = local_71c;
      local_694 = local_72c;
      local_690 = local_730;
      pvVar6 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                         ((array<siamese::OriginalPacket,_64UL> *)in_stack_fffffffffffff830,
                          (size_type)in_stack_fffffffffffff828);
      local_738 = (pvVar6->Buffer).Bytes;
      memcpy(*(void **)(in_RDI + 0x6c8),(pvVar6->Buffer).Data,(ulong)local_738);
      memset((void *)(*(long *)(in_RDI + 0x6c8) + (ulong)local_738),0,(ulong)(local_720 - local_738)
            );
      uVar5 = *(uint *)(in_RDI + 0x224);
      local_750 = local_71c;
      while (local_750 = local_750 + 1, local_750 < uVar5) {
        local_6e0 = in_RDI + 0x210;
        local_6e4 = local_750;
        pvVar6 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                           ((array<siamese::OriginalPacket,_64UL> *)in_stack_fffffffffffff830,
                            (size_type)in_stack_fffffffffffff828);
        uVar1 = (pvVar6->Buffer).Bytes;
        gf256_add_mem(in_stack_fffffffffffffa48,
                      (void *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                      (int)((ulong)in_stack_fffffffffffffa38 >> 0x20));
        if (local_738 < uVar1) {
          local_738 = uVar1;
        }
      }
    }
    local_688 = (undefined1 *)(*(long *)(in_RDI + 0x6c8) + (ulong)local_738);
    local_680 = &local_734;
    local_68c = 0;
    if (1 < local_72c) {
      *local_688 = (char)local_734;
      if (local_728 < 0x80) {
        local_688[1] = (char)local_728;
        local_5cc = 1;
      }
      else {
        local_688[1] = (char)local_728;
        local_688[2] = (byte)(local_728 >> 8) | 0x80;
        local_5cc = 2;
      }
      local_68c = local_5cc + 1;
    }
    puVar7 = local_688 + local_68c;
    uVar4 = (undefined1)local_730;
    if (local_730 < 0x80) {
      *puVar7 = uVar4;
      local_5a8 = 1;
    }
    else {
      bVar2 = (byte)(local_730 >> 8);
      if (local_730 < 0x4000) {
        *puVar7 = uVar4;
        puVar7[1] = bVar2 | 0x80;
        local_5a8 = 2;
      }
      else {
        *puVar7 = uVar4;
        puVar7[1] = bVar2;
        puVar7[2] = (byte)(local_730 >> 0x10) | 0xc0;
        local_5a8 = 3;
      }
    }
    uVar5 = local_72c - 1;
    puVar7 = local_688 + (local_5a8 + local_68c);
    if (uVar5 < 0x80) {
      *puVar7 = (char)uVar5;
      iVar8 = 1;
    }
    else {
      *puVar7 = (char)uVar5;
      puVar7[1] = (byte)(uVar5 >> 8) | 0x80;
      iVar8 = 2;
    }
    local_68c = iVar8 + local_5a8 + local_68c;
    *(undefined8 *)(local_718 + 2) = *(undefined8 *)(in_RDI + 0x6c8);
    *local_718 = local_738 + local_68c;
    local_640 = &local_728;
    local_650 = &local_72c;
    local_660 = &local_734;
    local_638 = " ldpcCount=";
    local_648 = " sumCount=";
    local_658 = " row=";
    this_00 = (OutputWorker *)&Logger;
    if (DAT_002b6400 < 3) {
      logger::LogStringBuffer::LogStringBuffer
                ((LogStringBuffer *)in_stack_fffffffffffff830,in_stack_fffffffffffff828,Trace);
      buffer_00 = (LogStringBuffer *)&Logger;
      std::operator<<(aoStack_520,(string *)&DAT_002b6430);
      std::operator<<(aoStack_520,"Generated Cauchy/parity recovery packet start=");
      std::ostream::operator<<(aoStack_520,local_730);
      std::operator<<(aoStack_520," ldpcCount=");
      std::ostream::operator<<(aoStack_520,local_728);
      std::operator<<(aoStack_520," sumCount=");
      std::ostream::operator<<(aoStack_520,local_72c);
      std::operator<<(aoStack_520," row=");
      std::ostream::operator<<(aoStack_520,local_734);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_00,buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1e1cca);
    }
    *(long *)(in_RDI + 0x1d8) = *(long *)(in_RDI + 0x1d8) + 1;
    *(ulong *)(in_RDI + 0x1e0) = (ulong)*local_718 + *(long *)(in_RDI + 0x1e0);
    local_708 = Siamese_Success;
  }
  else {
    *(undefined1 *)(in_RDI + 0x648) = 1;
    local_708 = Siamese_Disabled;
  }
  return local_708;
}

Assistant:

SiameseResult Encoder::GenerateCauchyPacket(SiameseRecoveryPacket& packet)
{
    // Reset recovery packet
    const unsigned firstElement  = Window.FirstUnremovedElement;
    const unsigned recoveryBytes = Window.LongestPacket;
    if (!RecoveryPacket.Initialize(&TheAllocator, recoveryBytes + kMaxRecoveryMetadataBytes))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    const unsigned unacknowledgedCount = Window.GetUnacknowledgedCount();
    RecoveryMetadata metadata;
    metadata.SumCount    = unacknowledgedCount;
    metadata.LDPCCount   = unacknowledgedCount;
    metadata.ColumnStart = Window.ElementToColumn(firstElement);

    // We have to recalculate the number of used bytes since the Cauchy/parity rows may be
    // shorter since they do not need to contain the start of the window which may be acked.
    unsigned usedBytes = 0;

    // If it is time to generate a new parity row:
    const unsigned nextParityElement = Window.ColumnToElement(NextParityColumn);
    if (nextParityElement <= firstElement || IsColumnDeltaNegative(nextParityElement))
    {
        // Set next time we write a parity row
        NextParityColumn = AddColumns(metadata.ColumnStart, unacknowledgedCount);

        // Row 0 is a parity row
        metadata.Row = 0;

        // Unroll first column
        OriginalPacket* original = Window.GetWindowElement(firstElement);
        unsigned originalBytes   = original->Buffer.Bytes;

        memcpy(RecoveryPacket.Data, original->Buffer.Data, originalBytes);
        // Pad the rest out with zeros to avoid corruption
        SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);
        memset(RecoveryPacket.Data + originalBytes, 0, recoveryBytes - originalBytes);

        usedBytes = originalBytes;

        // For each remaining column:
        for (unsigned element = firstElement + 1, count = Window.Count; element < count; ++element)
        {
            original      = Window.GetWindowElement(element);
            originalBytes = original->Buffer.Bytes;

            SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);

            gf256_add_mem(RecoveryPacket.Data, original->Buffer.Data, originalBytes);

            if (usedBytes < originalBytes)
                usedBytes = originalBytes;
        }
    }
    else
    {
        // Select Cauchy row number
        const unsigned cauchyRow = NextCauchyRow;
        metadata.Row = cauchyRow + 1;
        if (++NextCauchyRow >= kCauchyMaxRows)
            NextCauchyRow = 0;

        // Unroll first column
        unsigned cauchyColumn    = metadata.ColumnStart % kCauchyMaxColumns;
        OriginalPacket* original = Window.GetWindowElement(firstElement);
        uint8_t y                = CauchyElement(cauchyRow, cauchyColumn);
        unsigned originalBytes   = original->Buffer.Bytes;

        gf256_mul_mem(RecoveryPacket.Data, original->Buffer.Data, y, originalBytes);
        // Pad the rest out with zeros to avoid corruption
        SIAMESE_DEBUG_ASSERT(recoveryBytes >= originalBytes);
        SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);
        memset(RecoveryPacket.Data + originalBytes, 0, recoveryBytes - originalBytes);

        usedBytes = originalBytes;

        // For each remaining column:
        for (unsigned element = firstElement + 1, count = Window.Count; element < count; ++element)
        {
            cauchyColumn  = (cauchyColumn + 1) % kCauchyMaxColumns;
            original      = Window.GetWindowElement(element);
            originalBytes = original->Buffer.Bytes;
            y             = CauchyElement(cauchyRow, cauchyColumn);

            SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);

            gf256_muladd_mem(RecoveryPacket.Data, y, original->Buffer.Data, originalBytes);

            if (usedBytes < originalBytes)
                usedBytes = originalBytes;
        }
    }

    // Slap metadata footer on the end
    const unsigned footerBytes = SerializeFooter_RecoveryMetadata(metadata, RecoveryPacket.Data + usedBytes);

    packet.Data      = RecoveryPacket.Data;
    packet.DataBytes = usedBytes + footerBytes;

    Logger.Info("Generated Cauchy/parity recovery packet start=", metadata.ColumnStart, " ldpcCount=", metadata.LDPCCount, " sumCount=", metadata.SumCount, " row=", metadata.Row);

    Stats.Counts[SiameseEncoderStats_RecoveryCount]++;
    Stats.Counts[SiameseEncoderStats_RecoveryBytes] += packet.DataBytes;

    return Siamese_Success;
}